

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svlogd.c
# Opt level: O2

void rmoldest(logdir *ld)

{
  uint uVar1;
  int iVar2;
  DIR *__dirp;
  int *piVar3;
  dirent *pdVar4;
  uint uVar5;
  char *s;
  char oldest [30];
  
  oldest[0] = 'A';
  oldest[1] = '\0';
  oldest[0x1b] = '\0';
  while( true ) {
    __dirp = opendir(".");
    if (__dirp != (DIR *)0x0) break;
    pause2("unable to open directory, want rotate",ld->name);
  }
  piVar3 = __errno_location();
  uVar5 = 0;
  do {
    *piVar3 = 0;
    do {
      do {
        pdVar4 = readdir(__dirp);
        if (pdVar4 == (dirent *)0x0) {
          if (*piVar3 != 0) {
            warn2("unable to read directory",ld->name);
          }
          closedir(__dirp);
          if (ld->nmax < (ulong)uVar5 && ld->nmax != 0) {
            if (verbose != 0) {
              strerr_warn("svlogd: info: ","delete: ",ld->name,"/",oldest,(char *)0x0,(strerr *)0x0)
              ;
            }
            if (oldest[0] == '@') {
              iVar2 = unlink(oldest);
              if (iVar2 == -1) {
                warn2("unable to unlink oldest logfile",ld->name);
              }
            }
          }
          return;
        }
      } while (pdVar4->d_name[0] != '@');
      s = pdVar4->d_name;
      uVar1 = str_len(s);
    } while (uVar1 != 0x1b);
    if (pdVar4->d_name[0x1a] == 't') {
      iVar2 = unlink(s);
      if (iVar2 == -1) {
        warn2("unable to unlink processor leftover",s);
      }
    }
    else {
      uVar5 = uVar5 + 1;
      iVar2 = str_diff(s,oldest);
      if (iVar2 < 0) {
        byte_copy(oldest,0x1b,s);
      }
    }
  } while( true );
}

Assistant:

void rmoldest(struct logdir *ld) {
  DIR *d;
  direntry *f;
  char oldest[FMT_PTIME];
  int n =0;

  oldest[0] ='A'; oldest[1] =oldest[27] =0;
  while (! (d =opendir(".")))
    pause2("unable to open directory, want rotate", ld->name);
  errno =0;
  while ((f =readdir(d)))
    if ((f->d_name[0] == '@') && (str_len(f->d_name) == 27)) {
      if (f->d_name[26] == 't') {
        if (unlink(f->d_name) == -1)
          warn2("unable to unlink processor leftover", f->d_name);
      }
      else {
        ++n;
        if (str_diff(f->d_name, oldest) < 0) byte_copy(oldest, 27, f->d_name);
      }
      errno =0;
    }
  if (errno) warn2("unable to read directory", ld->name);
  closedir(d);

  if (ld->nmax && (n > ld->nmax)) {
    if (verbose) strerr_warn5(INFO, "delete: ", ld->name, "/", oldest, 0);
    if ((*oldest == '@') && (unlink(oldest) == -1))
      warn2("unable to unlink oldest logfile", ld->name);
  }
}